

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpControl.cpp
# Opt level: O1

void * gpControlThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  SOCKET SVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  CHRONO chrono_period;
  char szTemp [256];
  GPCONTROL gpcontrol;
  char szSaveFilePath [256];
  timespec local_ce8;
  int local_cd8;
  int local_cd4;
  timespec local_cd0;
  long local_cc0;
  long lStack_cb8;
  long local_cb0;
  long lStack_ca8;
  timespec local_ca0;
  int local_c90;
  char local_c88 [264];
  GPCONTROL local_b80;
  char local_138 [264];
  
  memset(&local_b80,0,0xa48);
  iVar4 = clock_getres(4,&local_ca0);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_cd0), iVar4 == 0)) {
    local_c90 = 0;
    local_cc0 = 0;
    lStack_cb8 = 0;
    local_cb0 = 0;
    lStack_ca8 = 0;
  }
  iVar4 = 100;
  bVar1 = false;
  local_cd8 = 0;
  do {
    local_cd4 = iVar4;
    while( true ) {
      if (local_c90 == 0) {
        clock_gettime(4,&local_ce8);
        local_cc0 = local_ce8.tv_sec;
        lStack_cb8 = local_ce8.tv_nsec;
        local_ce8.tv_sec =
             (local_ce8.tv_sec + local_cb0 + (local_ce8.tv_nsec + lStack_ca8) / 1000000000) -
             local_cd0.tv_sec;
        local_ce8.tv_nsec = (local_ce8.tv_nsec + lStack_ca8) % 1000000000 - local_cd0.tv_nsec;
        if (local_ce8.tv_nsec < 0) {
          local_ce8.tv_sec = local_ce8.tv_sec + local_ce8.tv_nsec / 1000000000 + -1;
          local_ce8.tv_nsec = local_ce8.tv_nsec % 1000000000 + 1000000000;
        }
        local_cb0 = local_ce8.tv_sec;
        lStack_ca8 = local_ce8.tv_nsec;
      }
      iVar5 = clock_getres(4,&local_ca0);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_cd0), iVar5 == 0)) {
        local_c90 = 0;
        local_cb0 = 0;
        lStack_ca8 = 0;
        local_cc0 = 0;
        lStack_cb8 = 0;
      }
      local_ce8.tv_sec = (long)iVar4 / 1000;
      local_ce8.tv_nsec = ((long)iVar4 % 1000) * 1000000;
      nanosleep(&local_ce8,(timespec *)0x0);
      iVar5 = local_cd4;
      if (bPausegpControl == 0) break;
      if (bVar1) {
        puts("gpControl Paused.");
        SVar3 = local_b80.tcpsock;
        if (local_b80.bDisableHTTPPersistent == 0) {
          shutdown(local_b80.tcpsock,2);
          iVar5 = close(SVar3);
          if (iVar5 != 0) {
            puts("Error while disconnecting a gpControl.");
            CloseRS232Port(&local_b80.RS232Port);
            goto LAB_001658e5;
          }
        }
        iVar5 = CloseRS232Port(&local_b80.RS232Port);
        if (iVar5 == 0) {
          pcVar14 = "gpControl disconnected.";
        }
        else {
          pcVar14 = "gpControl disconnection failed.";
        }
        puts(pcVar14);
      }
LAB_001658e5:
      if (bExit != 0) {
        bVar2 = true;
        goto LAB_00165c61;
      }
      local_ce8.tv_sec = 0;
      local_ce8.tv_nsec = 100000000;
      bVar1 = false;
      nanosleep(&local_ce8,(timespec *)0x0);
    }
    if (bRestartgpControl != 0) {
      if (bVar1) {
        puts("Restarting a gpControl.");
        SVar3 = local_b80.tcpsock;
        if (local_b80.bDisableHTTPPersistent == 0) {
          shutdown(local_b80.tcpsock,2);
          iVar4 = close(SVar3);
          if (iVar4 != 0) {
            puts("Error while disconnecting a gpControl.");
            CloseRS232Port(&local_b80.RS232Port);
            goto LAB_001659ab;
          }
        }
        iVar4 = CloseRS232Port(&local_b80.RS232Port);
        if (iVar4 == 0) {
          pcVar14 = "gpControl disconnected.";
        }
        else {
          pcVar14 = "gpControl disconnection failed.";
        }
        puts(pcVar14);
      }
LAB_001659ab:
      bRestartgpControl = 0;
      bVar1 = false;
    }
    if (bVar1) {
      iVar6 = KeepAlivegpControl(&local_b80);
      iVar4 = iVar5;
      if (iVar6 == 0) {
LAB_00165c13:
        bVar1 = true;
        bVar2 = false;
      }
      else {
        puts("Connection to a gpControl lost.");
        SVar3 = local_b80.tcpsock;
        if (local_b80.bDisableHTTPPersistent == 0) {
          shutdown(local_b80.tcpsock,2);
          iVar4 = close(SVar3);
          if (iVar4 != 0) {
            puts("Error while disconnecting a gpControl.");
            CloseRS232Port(&local_b80.RS232Port);
            goto LAB_00165b10;
          }
        }
        iVar4 = CloseRS232Port(&local_b80.RS232Port);
        if (iVar4 == 0) {
          pcVar14 = "gpControl disconnected.";
        }
        else {
          pcVar14 = "gpControl disconnection failed.";
        }
        puts(pcVar14);
LAB_00165b10:
        bVar1 = false;
        bVar2 = true;
        iVar4 = iVar5;
      }
    }
    else {
      iVar6 = ConnectgpControl(&local_b80,"gpControl0.txt");
      iVar4 = local_b80.threadperiod;
      if (iVar6 != 0) {
        local_ce8.tv_sec = 1;
        local_ce8.tv_nsec = 0;
        nanosleep(&local_ce8,(timespec *)0x0);
        goto LAB_00165b10;
      }
      if ((FILE *)local_b80.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_b80.pfSaveFile);
        local_b80.pfSaveFile = (FILE *)0x0;
      }
      bVar2 = false;
      bVar1 = true;
      if ((local_b80.bSaveRawData != 0) &&
         (bVar2 = false, (FILE *)local_b80.pfSaveFile == (FILE *)0x0)) {
        if (local_b80.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_c88,"gpcontrol",10);
        }
        else {
          sprintf(local_c88,"%.127s",local_b80.szCfgFilePath);
        }
        sVar8 = strlen(local_c88);
        uVar7 = (uint)sVar8;
        uVar13 = sVar8 & 0xffffffff;
        uVar9 = (int)uVar7 >> 0x1f & uVar7;
        uVar12 = sVar8 & 0xffffffff;
        do {
          uVar13 = uVar13 - 1;
          uVar11 = (uint)uVar12;
          uVar12 = (ulong)(uVar9 - 1);
          uVar10 = uVar9;
          if ((int)uVar11 < 1) break;
          uVar12 = (ulong)(uVar11 - 1);
          uVar10 = uVar11;
        } while (local_c88[uVar13 & 0xffffffff] != '.');
        if ((int)uVar10 <= (int)uVar7 && 1 < (int)uVar10) {
          memset(local_c88 + uVar12,0,sVar8 - uVar12);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar14 = strtimeex_fns();
        sprintf(local_138,"log/%.127s_%.64s.csv",local_c88,pcVar14);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_b80.pfSaveFile = (FILE *)fopen(local_138,"w");
        if ((FILE *)local_b80.pfSaveFile != (FILE *)0x0) {
          fwrite("tv_sec;tv_usec;val;\n",0x14,1,(FILE *)local_b80.pfSaveFile);
          fflush((FILE *)local_b80.pfSaveFile);
          goto LAB_00165c13;
        }
        puts("Unable to create gpControl data file.");
        bVar2 = false;
        break;
      }
    }
    if ((bVar2) &&
       (local_cd8 = local_cd8 + 1, ExitOnErrorCount <= local_cd8 && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
  } while (bExit == 0);
LAB_00165c61:
  if (local_c90 == 0) {
    clock_gettime(4,&local_ce8);
    local_cc0 = local_ce8.tv_sec;
    lStack_cb8 = local_ce8.tv_nsec;
    local_ce8.tv_sec =
         (local_ce8.tv_sec + local_cb0 + (local_ce8.tv_nsec + lStack_ca8) / 1000000000) -
         local_cd0.tv_sec;
    local_ce8.tv_nsec = (local_ce8.tv_nsec + lStack_ca8) % 1000000000 - local_cd0.tv_nsec;
    if (local_ce8.tv_nsec < 0) {
      local_ce8.tv_sec = local_ce8.tv_sec + local_ce8.tv_nsec / 1000000000 + -1;
      local_ce8.tv_nsec = local_ce8.tv_nsec % 1000000000 + 1000000000;
    }
    local_cb0 = local_ce8.tv_sec;
    lStack_ca8 = local_ce8.tv_nsec;
  }
  if ((FILE *)local_b80.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_b80.pfSaveFile);
    local_b80.pfSaveFile = (FILE *)0x0;
  }
  if (!bVar2) {
    if (local_b80.bDisableHTTPPersistent == 0) {
      shutdown(local_b80.tcpsock,2);
      iVar4 = close(local_b80.tcpsock);
      if (iVar4 != 0) {
        puts("Error while disconnecting a gpControl.");
        CloseRS232Port(&local_b80.RS232Port);
        goto LAB_00165da5;
      }
    }
    iVar4 = CloseRS232Port(&local_b80.RS232Port);
    if (iVar4 == 0) {
      pcVar14 = "gpControl disconnected.";
    }
    else {
      pcVar14 = "gpControl disconnection failed.";
    }
    puts(pcVar14);
  }
LAB_00165da5:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE gpControlThread(void* pParam)
{
	GPCONTROL gpcontrol;
	//struct timeval tv;
	//double val = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&gpcontrol, 0, sizeof(GPCONTROL));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPausegpControl)
		{
			if (bConnected)
			{
				printf("gpControl Paused.\n");
				bConnected = FALSE;
				DisconnectgpControl(&gpcontrol);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartgpControl)
		{
			if (bConnected)
			{
				printf("Restarting a gpControl.\n");
				bConnected = FALSE;
				DisconnectgpControl(&gpcontrol);
			}
			bRestartgpControl = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectgpControl(&gpcontrol, "gpControl0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = gpcontrol.threadperiod;

				if (gpcontrol.pfSaveFile != NULL)
				{
					fclose(gpcontrol.pfSaveFile); 
					gpcontrol.pfSaveFile = NULL;
				}
				if ((gpcontrol.bSaveRawData)&&(gpcontrol.pfSaveFile == NULL)) 
				{
					if (strlen(gpcontrol.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", gpcontrol.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "gpcontrol");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					gpcontrol.pfSaveFile = fopen(szSaveFilePath, "w");
					if (gpcontrol.pfSaveFile == NULL) 
					{
						printf("Unable to create gpControl data file.\n");
						break;
					}
					fprintf(gpcontrol.pfSaveFile, "tv_sec;tv_usec;val;\n"); 
					fflush(gpcontrol.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (KeepAlivegpControl(&gpcontrol) == EXIT_SUCCESS)
			{
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				//EnterCriticalSection(&StateVariablesCS);


				//LeaveCriticalSection(&StateVariablesCS);

				//if (gpcontrol.bSaveRawData)
				//{
				//	fprintf(gpcontrol.pfSaveFile, "%d;%d;%f;\n", (int)tv.tv_sec, (int)tv.tv_usec, val);
				//	fflush(gpcontrol.pfSaveFile);
				//}
			}
			else
			{
				printf("Connection to a gpControl lost.\n");
				bConnected = FALSE;
				DisconnectgpControl(&gpcontrol);
			}		
		}

		//printf("gpControlThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (gpcontrol.pfSaveFile != NULL)
	{
		fclose(gpcontrol.pfSaveFile); 
		gpcontrol.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectgpControl(&gpcontrol);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}